

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O2

void __thiscall QMakeEvaluator::runProcess(QMakeEvaluator *this,QProcess *proc,QString *command)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<QString> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  currentDirectory((QString *)&local_50,this);
  QProcess::setWorkingDirectory((QString *)proc);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  qVar1 = QtPrivate::lengthHelperPointer<char>("/bin/sh");
  latin1.m_data = "/bin/sh";
  latin1.m_size = qVar1;
  QString::QString((QString *)&local_50,latin1);
  local_68.d = (Data *)0x0;
  local_68.ptr = (QString *)0x0;
  local_68.size = 0;
  qVar1 = QtPrivate::lengthHelperPointer<char>("-c");
  latin1_00.m_data = "-c";
  latin1_00.m_size = qVar1;
  QString::QString((QString *)&local_80,latin1_00);
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_68,(QString *)&local_80);
  QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_68,command);
  QProcess::start(proc,&local_50,&local_68,3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QProcess::waitForFinished((int)proc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::runProcess(QProcess *proc, const QString &command) const
{
    proc->setWorkingDirectory(currentDirectory());
# ifdef PROEVALUATOR_SETENV
    if (!m_option->environment.isEmpty())
        proc->setProcessEnvironment(m_option->environment);
# endif
# ifdef Q_OS_WIN
    proc->setNativeArguments(QLatin1String("/v:off /s /c \"") + command + QLatin1Char('"'));
    proc->start(m_option->getEnv(QLatin1String("COMSPEC")), QStringList());
# else
    proc->start(QLatin1String("/bin/sh"), QStringList() << QLatin1String("-c") << command);
# endif
    proc->waitForFinished(-1);
}